

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall
google::protobuf::DynamicMessageFactory::~DynamicMessageFactory(DynamicMessageFactory *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer offsets;
  Descriptor *in_RDI;
  iterator iter;
  unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
  *in_stack_ffffffffffffffb8;
  TypeInfo *in_stack_ffffffffffffffc0;
  Descriptor *default_oneof_instance;
  _Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false>
  local_18;
  _Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false>
  local_10 [2];
  
  *(undefined ***)in_RDI = &PTR__DynamicMessageFactory_00968990;
  std::
  unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
  ::operator->((unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                *)0x55de8a);
  local_10[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    std::
    unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
    ::operator->((unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                  *)0x55dea5);
    local_18._M_cur =
         (__node_type *)
         std::
         unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::__detail::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
                           *)0x55ded9);
    default_oneof_instance = ppVar2->second->type;
    std::__detail::
    _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
                  *)0x55def0);
    offsets = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                        ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                         in_stack_ffffffffffffffc0);
    std::__detail::
    _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
                  *)0x55df0c);
    DeleteDefaultOneofInstance(in_RDI,offsets,default_oneof_instance);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
                           *)0x55df2f);
    in_stack_ffffffffffffffc0 = ppVar2->second;
    if (in_stack_ffffffffffffffc0 != (TypeInfo *)0x0) {
      DynamicMessage::TypeInfo::~TypeInfo(in_stack_ffffffffffffffc0);
      operator_delete(in_stack_ffffffffffffffc0);
    }
    std::__detail::
    _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_false>
                  *)in_stack_ffffffffffffffc0);
  }
  std::
  unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                 *)in_stack_ffffffffffffffc0);
  MessageFactory::~MessageFactory((MessageFactory *)in_RDI);
  return;
}

Assistant:

DynamicMessageFactory::~DynamicMessageFactory() {
  for (PrototypeMap::Map::iterator iter = prototypes_->map_.begin();
       iter != prototypes_->map_.end(); ++iter) {
    DeleteDefaultOneofInstance(iter->second->type, iter->second->offsets.get(),
                               iter->second->prototype);
    delete iter->second;
  }
}